

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O0

int __thiscall TCPConnection::Read(TCPConnection *this)

{
  byte bVar1;
  ushort uVar2;
  int rc;
  TCPConnection *this_local;
  
  while ((this->RxBufferEmpty & 1U) != 0) {
    if (this->LastAck != this->AcknowledgementNumber) {
      SendFlags(this,'\x10');
    }
    osEvent::Wait(&this->Event,
                  "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/tcp_stack/TCPConnection.cpp"
                  ,0x109,-1);
  }
  uVar2 = this->RxOutOffset;
  this->RxOutOffset = uVar2 + 1;
  bVar1 = this->RxBuffer[uVar2];
  if (0xff < this->RxOutOffset) {
    this->RxOutOffset = 0;
  }
  this->AcknowledgementNumber = this->AcknowledgementNumber + 1;
  this->CurrentWindow = this->CurrentWindow + 1;
  if (this->RxOutOffset == this->RxInOffset) {
    this->RxBufferEmpty = true;
  }
  return (uint)bVar1;
}

Assistant:

int TCPConnection::Read()
{
    int rc = -1;

    while (RxBufferEmpty)
    {
        if (LastAck != AcknowledgementNumber)
        {
            SendFlags(FLAG_ACK);
        }
        Event.Wait(__FILE__, __LINE__);
    }

    rc = RxBuffer[RxOutOffset++];
    if (RxOutOffset >= TCP_RX_WINDOW_SIZE)
    {
        RxOutOffset = 0;
    }
    AcknowledgementNumber++;
    CurrentWindow++;

    if (RxOutOffset == RxInOffset)
    {
        RxBufferEmpty = true;
    }

    // if( CurrentWindow == TCP_RX_WINDOW_SIZE && LastAck != AcknowledgementNumber )
    //{
    //   // The Rx buffer is empty, might as well ack
    //   Send( FLAG_ACK );
    //}

    return rc;
}